

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSString * js_alloc_string(JSContext *ctx,int max_len,int is_wide_char)

{
  JSString *pJVar1;
  
  pJVar1 = (JSString *)
           (*(ctx->rt->mf).js_malloc)
                     (&ctx->rt->malloc_state,
                      ((long)(max_len << ((byte)is_wide_char & 0x1f)) - (ulong)(uint)is_wide_char) +
                      0x11);
  if (pJVar1 == (JSString *)0x0) {
    js_alloc_string_cold_1();
  }
  else {
    (pJVar1->header).ref_count = 1;
    *(ulong *)&pJVar1->field_0x4 = (ulong)(max_len & 0x7fffffffU | is_wide_char << 0x1f);
    pJVar1->hash_next = 0;
  }
  return pJVar1;
}

Assistant:

static JSString *js_alloc_string(JSContext *ctx, int max_len, int is_wide_char)
{
    JSString *p;
    p = js_alloc_string_rt(ctx->rt, max_len, is_wide_char);
    if (unlikely(!p)) {
        JS_ThrowOutOfMemory(ctx);
        return NULL;
    }
    return p;
}